

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall Lodtalk::StackInterpreter::fetchFrameData(StackInterpreter *this)

{
  uint8_t *puVar1;
  uintptr_t metadata;
  CompiledMethod *pCVar2;
  Oop *pOVar3;
  StackInterpreter *this_local;
  
  puVar1 = StackMemory::getFramePointer(this->stack);
  if (puVar1 == (uint8_t *)0x0) {
    abort();
  }
  metadata = StackMemory::getMetadata(this->stack);
  decodeFrameMetaData(metadata,&this->hasContext,&this->isBlock,&this->argumentCount);
  pCVar2 = StackMemory::getMethod(this->stack);
  this->method = pCVar2;
  if (this->method == (CompiledMethod *)0x0) {
    this->literalArray = (Oop *)0x0;
  }
  else {
    pOVar3 = CompiledMethod::getFirstLiteralPointer(this->method);
    this->literalArray = pOVar3;
  }
  return;
}

Assistant:

void StackInterpreter::fetchFrameData()
{
    if (!stack->getFramePointer())
    {
        // Should never reach here.
        abort();
        return;
    }

	// Decode the frame metadata.
	decodeFrameMetaData(stack->getMetadata(), this->hasContext, this->isBlock, argumentCount);

	// Get the method and the literal array
	method = stack->getMethod();
    if (method)
        literalArray = method->getFirstLiteralPointer();
    else
        literalArray = nullptr;
}